

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnns_index.h
# Opt level: O2

void __thiscall
gnns::Gnns_Index<L2Distance<float>_>::setDataset
          (Gnns_Index<L2Distance<float>_> *this,Matrix<float> *data)

{
  uint uVar1;
  int i;
  uint uVar2;
  float *local_30;
  
  uVar1 = data->rows;
  this->points_num = uVar1;
  this->vec_len = data->cols;
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    local_30 = data->data + data->cols * uVar2;
    std::vector<float*,std::allocator<float*>>::emplace_back<float*>
              ((vector<float*,std::allocator<float*>> *)&this->points,&local_30);
    uVar1 = this->points_num;
  }
  return;
}

Assistant:

void setDataset(const Matrix<ElementType>& data)
        {
            this->points_num = data.rows;
            this->vec_len = data.cols;
            for(int i=0;i<points_num;++i)
            {
                points.push_back(data[i]);
            }
        }